

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void FastPForLib::checkifdivisibleby(size_t a,uint32_t x)

{
  bool bVar1;
  logic_error *this;
  uint32_t in_ESI;
  size_t in_RDI;
  string msg;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_a0 [28];
  uint in_stack_ffffffffffffff7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  bVar1 = divisibleby(in_RDI,in_ESI);
  if (!bVar1) {
    __lhs = local_70;
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff88);
    std::operator+(__lhs,in_stack_ffffffffffffff50);
    std::__cxx11::to_string(in_stack_ffffffffffffff7c);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)local_70);
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,local_30);
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

inline void checkifdivisibleby(size_t a, uint32_t x) {
  if (!divisibleby(a, x)) {
    std::string msg = std::to_string(a) + " not divisible by "
                    + std::to_string(x);
    throw std::logic_error(msg);
  }
}